

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

StructNew * __thiscall
wasm::Builder::makeStructNew<ArenaVector<wasm::Expression*>>
          (Builder *this,HeapType type,ArenaVector<wasm::Expression_*> *args)

{
  Type local_30;
  StructNew *local_28;
  StructNew *ret;
  ArenaVector<wasm::Expression_*> *args_local;
  Builder *this_local;
  HeapType type_local;
  
  ret = (StructNew *)args;
  args_local = (ArenaVector<wasm::Expression_*> *)this;
  this_local = (Builder *)type.id;
  local_28 = MixedArena::alloc<wasm::StructNew>(&this->wasm->allocator);
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<ArenaVector<wasm::Expression*>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)
             &local_28->operands,(ArenaVector<wasm::Expression_*> *)ret);
  wasm::Type::Type(&local_30,(HeapType)this_local,NonNullable,Inexact);
  (local_28->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.type.id =
       local_30.id;
  StructNew::finalize(local_28);
  return local_28;
}

Assistant:

StructNew* makeStructNew(HeapType type, const T& args) {
    auto* ret = wasm.allocator.alloc<StructNew>();
    ret->operands.set(args);
    ret->type = Type(type, NonNullable);
    ret->finalize();
    return ret;
  }